

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O0

unsigned_long_long *
meshopt::hashLookup<unsigned_long_long,meshopt::EdgeHasher>
          (unsigned_long_long *table,size_t buckets,EdgeHasher *hash,unsigned_long_long *key,
          unsigned_long_long *empty)

{
  bool bVar1;
  unsigned_long_long *puVar2;
  unsigned_long_long *in_RCX;
  EdgeHasher *in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long_long *in_R8;
  unsigned_long_long *item;
  size_t probe;
  size_t bucket;
  size_t hashmod;
  ulong local_48;
  ulong local_40;
  
  local_40 = EdgeHasher::hash(in_RDX,*in_RCX);
  local_48 = 0;
  while( true ) {
    local_40 = local_40 & in_RSI - 1U;
    if (in_RSI - 1U < local_48) {
      return (unsigned_long_long *)0x0;
    }
    puVar2 = (unsigned_long_long *)(in_RDI + local_40 * 8);
    if (*puVar2 == *in_R8) break;
    bVar1 = EdgeHasher::equal(in_RDX,*puVar2,*in_RCX);
    if (bVar1) {
      return puVar2;
    }
    local_40 = local_40 + local_48 + 1;
    local_48 = local_48 + 1;
  }
  return puVar2;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}